

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O1

bool __thiscall ForbiddenPointFinder::isOverline(ForbiddenPointFinder *this,int x,int y)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Stone (*paSVar6) [17];
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Stone *pSVar13;
  Stone *pSVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  
  lVar9 = (long)x;
  if (this->cBoard[lVar9 + 1][(long)y + 1] != Empty) {
    return false;
  }
  pSVar13 = this->cBoard[lVar9 + 1] + (long)y + 1;
  *pSVar13 = Black;
  if (x < 1) {
    uVar8 = 1;
  }
  else {
    uVar7 = 1;
    uVar11 = x;
    do {
      uVar8 = uVar7;
      if (this->cBoard[uVar11][(long)y + 1] != Black) break;
      uVar11 = uVar11 - 1;
      bVar18 = uVar7 != x;
      uVar7 = uVar7 + 1;
      uVar8 = x + 1;
    } while (bVar18);
  }
  iVar1 = x + 2;
  uVar7 = uVar8;
  if (x < 0xe) {
    lVar17 = (long)iVar1;
    iVar4 = uVar8 - x;
    pSVar14 = this->cBoard[lVar17] + (long)y + 1;
    do {
      lVar17 = lVar17 + 1;
      uVar7 = uVar8;
      if (*pSVar14 != Black) break;
      uVar8 = uVar8 + 1;
      pSVar14 = pSVar14 + 0x11;
      uVar7 = iVar4 + 0xe;
    } while ((int)lVar17 != 0x10);
  }
  if (uVar7 != 5) {
    if (y < 1) {
      uVar8 = 1;
    }
    else {
      uVar11 = 1;
      uVar2 = y;
      do {
        uVar8 = uVar11;
        if (this->cBoard[lVar9 + 1][uVar2] != Black) break;
        uVar2 = uVar2 - 1;
        bVar18 = uVar11 != y;
        uVar11 = uVar11 + 1;
        uVar8 = y + 1;
      } while (bVar18);
    }
    iVar4 = y + 2;
    uVar11 = uVar8;
    if (y < 0xe) {
      iVar3 = uVar8 - y;
      lVar17 = (long)iVar4 + 0x1d6;
      do {
        uVar11 = uVar8;
        if (*(int *)((long)this->ptForbidden + lVar17 * 4 + lVar9 * 0x44 + -0xc) != 0x58) break;
        uVar8 = uVar8 + 1;
        iVar15 = (int)lVar17;
        lVar17 = lVar17 + 1;
        uVar11 = iVar3 + 0xe;
      } while (iVar15 != 0x1e5);
    }
    if (uVar11 != 5) {
      uVar8 = 1;
      if (0 < y && 0 < x) {
        uVar2 = x - 1U;
        if (y - 1U < x - 1U) {
          uVar2 = y - 1U;
        }
        uVar16 = 1;
        uVar5 = y;
        uVar12 = x;
        do {
          uVar8 = uVar16;
          if (this->cBoard[uVar12][uVar5] != Black) break;
          uVar5 = uVar5 - 1;
          uVar12 = uVar12 - 1;
          uVar8 = uVar16 + 1;
          iVar3 = uVar16 - uVar2;
          uVar16 = uVar8;
        } while (iVar3 != 1);
      }
      if (y < 0xe && x < 0xe) {
        lVar17 = (long)iVar1;
        pSVar14 = this->cBoard[lVar17] + iVar4;
        lVar9 = (long)iVar4;
        do {
          if ((*pSVar14 != Black) || (uVar8 = uVar8 + 1, 0xe < lVar17)) break;
          lVar17 = lVar17 + 1;
          pSVar14 = pSVar14 + 0x12;
          bVar18 = lVar9 < 0xf;
          lVar9 = lVar9 + 1;
        } while (bVar18);
      }
      if (uVar8 != 5) {
        uVar2 = 1;
        if (y < 0xe && 0 < x) {
          lVar9 = 0;
          uVar2 = x;
          do {
            if (this->cBoard[uVar2][iVar4 + lVar9] != Black) {
              uVar2 = (int)lVar9 + 1;
              goto LAB_00102f4f;
            }
            lVar17 = lVar9 + 1;
          } while ((1 < (int)uVar2) &&
                  (lVar10 = lVar9 + iVar4, uVar2 = uVar2 - 1, lVar9 = lVar17, lVar10 < 0xf));
          uVar2 = (int)lVar17 + 1;
        }
LAB_00102f4f:
        if (0 < y && x < 0xe) {
          lVar9 = (long)iVar1;
          paSVar6 = this->cBoard + lVar9;
          do {
            if (((*paSVar6)[(uint)y] != Black) || (uVar2 = uVar2 + 1, 0xe < lVar9)) break;
            lVar9 = lVar9 + 1;
            paSVar6 = paSVar6 + 1;
            bVar18 = 1 < y;
            y = y - 1;
          } while (bVar18);
        }
        if (uVar2 != 5) {
          bVar18 = 5 < uVar2 || ((5 < uVar7 || 5 < uVar11) || 5 < uVar8);
          goto LAB_00102fa0;
        }
      }
    }
  }
  bVar18 = false;
LAB_00102fa0:
  *pSVar13 = Empty;
  return bVar18;
}

Assistant:

bool ForbiddenPointFinder::isOverline(int x, int y) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    setStone(x, y, Stone::Black);

    // detect black overline
    int i, j;
    bool bOverline = false;

    // 1 - horizontal direction
    int nLine = 1;
    i = x;
    while (i > 0) {
        if (cBoard[i--][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[i++][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 2 - vertical direction
    nLine = 1;
    i = y;
    while (i > 0) {
        if (cBoard[x + 1][i--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = y + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[x + 1][i++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 3 - diagonal direction (lower-left to upper-right: '/')
    nLine = 1;
    i = x;
    j = y;
    while ((i > 0) && (j > 0)) {
        if (cBoard[i--][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y + 2;
    while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
        if (cBoard[i++][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 4 - diagonal direction (upper-left to lower-right: '\')
    nLine = 1;
    i = x;
    j = y + 2;
    while ((i > 0) && (j < (BoardSize + 1))) {
        if (cBoard[i--][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y;
    while ((i < (BoardSize + 1)) && (j > 0)) {
        if (cBoard[i++][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    setStone(x, y, Stone::Empty);
    return bOverline;
}